

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O1

void __thiscall
google::protobuf::ServiceDescriptor::CopyTo(ServiceDescriptor *this,ServiceDescriptorProto *proto)

{
  int iVar1;
  string *initial_value;
  string *psVar2;
  long lVar3;
  Rep *pRVar4;
  MethodDescriptorProto *proto_00;
  ServiceOptions *pSVar5;
  ServiceOptions *pSVar6;
  long lVar7;
  Arena *pAVar8;
  long lVar9;
  
  initial_value = *(string **)this;
  (proto->_has_bits_).has_bits_[0] = (proto->_has_bits_).has_bits_[0] | 1;
  pAVar8 = (Arena *)(proto->_internal_metadata_).
                    super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                    .ptr_;
  if (((ulong)pAVar8 & 1) != 0) {
    pAVar8 = *(Arena **)(((ulong)pAVar8 & 0xfffffffffffffffe) + 0x18);
  }
  psVar2 = (proto->name_).ptr_;
  if (psVar2 == (string *)&internal::fixed_address_empty_string_abi_cxx11_) {
    internal::ArenaStringPtr::CreateInstance(&proto->name_,pAVar8,initial_value);
  }
  else {
    std::__cxx11::string::_M_assign((string *)psVar2);
  }
  if (0 < *(int *)(this + 0x28)) {
    lVar9 = 0;
    lVar7 = 0;
    do {
      lVar3 = *(long *)(this + 0x20);
      pRVar4 = (proto->method_).super_RepeatedPtrFieldBase.rep_;
      if (pRVar4 == (Rep *)0x0) {
LAB_002d2f13:
        internal::RepeatedPtrFieldBase::Reserve
                  (&(proto->method_).super_RepeatedPtrFieldBase,
                   (proto->method_).super_RepeatedPtrFieldBase.total_size_ + 1);
LAB_002d2f21:
        pRVar4 = (proto->method_).super_RepeatedPtrFieldBase.rep_;
        pRVar4->allocated_size = pRVar4->allocated_size + 1;
        proto_00 = Arena::CreateMaybeMessage<google::protobuf::MethodDescriptorProto>
                             ((proto->method_).super_RepeatedPtrFieldBase.arena_);
        pRVar4 = (proto->method_).super_RepeatedPtrFieldBase.rep_;
        iVar1 = (proto->method_).super_RepeatedPtrFieldBase.current_size_;
        (proto->method_).super_RepeatedPtrFieldBase.current_size_ = iVar1 + 1;
        pRVar4->elements[iVar1] = proto_00;
      }
      else {
        iVar1 = (proto->method_).super_RepeatedPtrFieldBase.current_size_;
        if (pRVar4->allocated_size <= iVar1) {
          if (pRVar4->allocated_size == (proto->method_).super_RepeatedPtrFieldBase.total_size_)
          goto LAB_002d2f13;
          goto LAB_002d2f21;
        }
        (proto->method_).super_RepeatedPtrFieldBase.current_size_ = iVar1 + 1;
        proto_00 = (MethodDescriptorProto *)pRVar4->elements[iVar1];
      }
      MethodDescriptor::CopyTo((MethodDescriptor *)(lVar3 + lVar9),proto_00);
      lVar7 = lVar7 + 1;
      lVar9 = lVar9 + 0x68;
    } while (lVar7 < *(int *)(this + 0x28));
  }
  pSVar6 = *(ServiceOptions **)(this + 0x18);
  pSVar5 = ServiceOptions::default_instance();
  if (pSVar6 != pSVar5) {
    *(byte *)(proto->_has_bits_).has_bits_ = (byte)(proto->_has_bits_).has_bits_[0] | 2;
    if (proto->options_ == (ServiceOptions *)0x0) {
      pAVar8 = (Arena *)(proto->_internal_metadata_).
                        super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                        .ptr_;
      if (((ulong)pAVar8 & 1) != 0) {
        pAVar8 = *(Arena **)(((ulong)pAVar8 & 0xfffffffffffffffe) + 0x18);
      }
      pSVar6 = Arena::CreateMaybeMessage<google::protobuf::ServiceOptions>(pAVar8);
      proto->options_ = pSVar6;
    }
    ServiceOptions::CopyFrom(proto->options_,*(ServiceOptions **)(this + 0x18));
    return;
  }
  return;
}

Assistant:

void ServiceDescriptor::CopyTo(ServiceDescriptorProto* proto) const {
  proto->set_name(name());

  for (int i = 0; i < method_count(); i++) {
    method(i)->CopyTo(proto->add_method());
  }

  if (&options() != &ServiceOptions::default_instance()) {
    proto->mutable_options()->CopyFrom(options());
  }
}